

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall icu_63::VArray::add(VArray *this,void *elem,UErrorCode *status)

{
  int iVar1;
  UBool UVar2;
  void **ppvVar3;
  size_t count;
  void *start;
  UErrorCode *status_local;
  void *elem_local;
  VArray *this_local;
  
  UVar2 = ::U_SUCCESS(*status);
  if (UVar2 != '\0') {
    if (this->size == this->cap) {
      if (this->cap == 0) {
        this->cap = 1;
      }
      else if (this->cap < 0x100) {
        this->cap = this->cap << 1;
      }
      else {
        this->cap = this->cap + 0x100;
      }
      if (this->buf == (void **)0x0) {
        ppvVar3 = (void **)uprv_malloc_63((long)this->cap << 3);
        this->buf = ppvVar3;
      }
      else {
        ppvVar3 = (void **)uprv_realloc_63(this->buf,(long)this->cap << 3);
        this->buf = ppvVar3;
      }
      if (this->buf == (void **)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      memset(this->buf + this->size,0,(long)(this->cap - this->size) << 3);
    }
    iVar1 = this->size;
    this->size = iVar1 + 1;
    this->buf[iVar1] = elem;
  }
  return;
}

Assistant:

void add(void* elem, UErrorCode& status) {
        if (U_SUCCESS(status)) {
            if (size == cap) {
                if (cap == 0) {
                    cap = 1;
                } else if (cap < 256) {
                    cap *= 2;
                } else {
                    cap += 256;
                }
                if (buf == NULL) {
                    buf = (void**)uprv_malloc(cap * sizeof(void*));
                } else {
                    buf = (void**)uprv_realloc(buf, cap * sizeof(void*));
                }
                if (buf == NULL) {
                    // if we couldn't realloc, we leak the memory we've already allocated, but we're in deep trouble anyway
                    status = U_MEMORY_ALLOCATION_ERROR;
                    return;
                }
                void* start = &buf[size];
                size_t count = (cap - size) * sizeof(void*);
                uprv_memset(start, 0, count); // fill with nulls, just because
            }
            buf[size++] = elem;
        }
    }